

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

int Abc_NodeIsConst1(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  Mio_Gate_t *pMVar2;
  int iVar3;
  uint uVar4;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar5;
  
  pAVar1 = pNode->pNtk;
  if (1 < pAVar1->ntkType - ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x396,"int Abc_NodeIsConst1(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x397,"int Abc_NodeIsConst1(Abc_Obj_t *)");
  }
  iVar3 = Abc_NodeIsConst(pNode);
  if (iVar3 == 0) {
    uVar4 = 0;
  }
  else {
    switch(pAVar1->ntkFunc) {
    case ABC_FUNC_SOP:
      iVar3 = Abc_SopIsConst1((char *)(pNode->field_5).pData);
      return iVar3;
    case ABC_FUNC_BDD:
    case ABC_FUNC_AIG:
      uVar4 = ~(pNode->field_5).iData & 1;
      break;
    case ABC_FUNC_MAP:
      pMVar2 = (Mio_Gate_t *)(pNode->field_5).pData;
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pMVar5 = Mio_LibraryReadConst1(pLib);
      uVar4 = (uint)(pMVar2 == pMVar5);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                    ,0x3a4,"int Abc_NodeIsConst1(Abc_Obj_t *)");
    }
  }
  return uVar4;
}

Assistant:

int Abc_NodeIsConst1( Abc_Obj_t * pNode )    
{ 
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) );      
    if ( !Abc_NodeIsConst(pNode) )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
        return Abc_SopIsConst1((char *)pNode->pData);
#ifdef ABC_USE_CUDD
    if ( Abc_NtkHasBdd(pNtk) )
        return !Cudd_IsComplement(pNode->pData);
#endif
    if ( Abc_NtkHasAig(pNtk) )
        return !Hop_IsComplement((Hop_Obj_t *)pNode->pData);
    if ( Abc_NtkHasMapping(pNtk) )
        return pNode->pData == Mio_LibraryReadConst1((Mio_Library_t *)Abc_FrameReadLibGen());
    assert( 0 );
    return 0;
}